

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

SAM_hdr * sam_hdr_parse_(char *hdr,int len)

{
  int iVar1;
  SAM_hdr *sh;
  
  sh = sam_hdr_new();
  if (sh != (SAM_hdr *)0x0) {
    if (hdr == (char *)0x0) {
      return sh;
    }
    iVar1 = sam_hdr_add_lines(sh,hdr,len);
    if (iVar1 != -1) {
      sam_hdr_link_pg(sh);
      return sh;
    }
    sam_hdr_free(sh);
  }
  return (SAM_hdr *)0x0;
}

Assistant:

SAM_hdr *sam_hdr_parse_(const char *hdr, int len) {
    /* Make an empty SAM_hdr */
    SAM_hdr *sh;
    
    sh = sam_hdr_new();
    if (NULL == sh) return NULL;

    if (NULL == hdr) return sh; // empty header is permitted

    /* Parse the header, line by line */
    if (-1 == sam_hdr_add_lines(sh, hdr, len)) {
	sam_hdr_free(sh);
	return NULL;
    }

    //sam_hdr_dump(sh);
    //sam_hdr_add(sh, "RG", "ID", "foo", "SM", "bar", NULL);
    //sam_hdr_rebuild(sh);
    //printf(">>%s<<", ks_str(sh->text));

    //parse_references(sh);
    //parse_read_groups(sh);

    sam_hdr_link_pg(sh);
    //sam_hdr_dump(sh);

    return sh;
}